

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_curve.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::curve
          (Fl_Graphics_Driver *this,double X0,double Y0,double X1,double Y1,double X2,double Y2,
          double X3,double Y3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double xf;
  double yf;
  double dVar5;
  double dVar6;
  undefined4 local_114;
  double dStack_110;
  int m;
  double dy2;
  double dy3;
  double dy1;
  double yc;
  double yb;
  double ya;
  double dx2;
  double dx3;
  double dx1;
  double xc;
  double xb;
  double xa;
  double e;
  int n;
  double b;
  double a;
  double y3;
  double x3;
  double y2;
  double x2;
  double yy1;
  double x1;
  double y;
  double x;
  double Y3_local;
  double X3_local;
  double Y2_local;
  double X2_local;
  double Y1_local;
  double X1_local;
  double Y0_local;
  double X0_local;
  Fl_Graphics_Driver *this_local;
  
  y = fl_transform_x(X0,Y0);
  x1 = fl_transform_y(X0,Y0);
  fl_transformed_vertex(y,x1);
  dVar1 = fl_transform_x(X1,Y1);
  dVar2 = fl_transform_y(X1,Y1);
  dVar3 = fl_transform_x(X2,Y2);
  dVar4 = fl_transform_y(X2,Y2);
  xf = fl_transform_x(X3,Y3);
  yf = fl_transform_y(X3,Y3);
  b = ABS((y - dVar3) * (yf - dVar2) + -((x1 - dVar4) * (xf - dVar1)));
  dVar5 = ABS((y - xf) * (dVar4 - dVar2) + -((x1 - yf) * (dVar3 - dVar1)));
  if (b < dVar5) {
    b = dVar5;
  }
  dVar5 = sqrt(b);
  e._4_4_ = (int)(dVar5 / 4.0);
  if (1 < e._4_4_) {
    if (100 < e._4_4_) {
      e._4_4_ = 100;
    }
    dVar5 = 1.0 / (double)e._4_4_;
    dVar6 = (dVar1 * 3.0 + dVar3 * -3.0 + xf) - y;
    dVar3 = ((dVar3 - (dVar1 + dVar1)) + y) * 3.0;
    dx3 = ((dVar6 * dVar5 + dVar3) * dVar5 + (dVar1 - y) * 3.0) * dVar5;
    ya = dVar3 * 2.0 * dVar5 * dVar5;
    dVar1 = (dVar2 * 3.0 + dVar4 * -3.0 + yf) - x1;
    dVar3 = ((dVar4 - (dVar2 + dVar2)) + x1) * 3.0;
    dy3 = ((dVar1 * dVar5 + dVar3) * dVar5 + (dVar2 - x1) * 3.0) * dVar5;
    dStack_110 = dVar3 * 2.0 * dVar5 * dVar5;
    for (local_114 = 2; ya = ya + dVar6 * 6.0 * dVar5 * dVar5 * dVar5,
        dStack_110 = dStack_110 + dVar1 * 6.0 * dVar5 * dVar5 * dVar5, local_114 < e._4_4_;
        local_114 = local_114 + 1) {
      y = dx3 + y;
      dx3 = ya + dx3;
      x1 = dy3 + x1;
      dy3 = dStack_110 + dy3;
      fl_transformed_vertex(y,x1);
    }
    fl_transformed_vertex(y + dx3,x1 + dy3);
  }
  fl_transformed_vertex(xf,yf);
  return;
}

Assistant:

void Fl_Graphics_Driver::curve(double X0, double Y0,
	      double X1, double Y1,
	      double X2, double Y2,
	      double X3, double Y3) {

  double x = fl_transform_x(X0,Y0);
  double y = fl_transform_y(X0,Y0);

  // draw point 0:
  fl_transformed_vertex(x,y);

  double x1 = fl_transform_x(X1,Y1);
  double yy1 = fl_transform_y(X1,Y1);
  double x2 = fl_transform_x(X2,Y2);
  double y2 = fl_transform_y(X2,Y2);
  double x3 = fl_transform_x(X3,Y3);
  double y3 = fl_transform_y(X3,Y3);

  // find the area:
  double a = fabs((x-x2)*(y3-yy1)-(y-y2)*(x3-x1));
  double b = fabs((x-x3)*(y2-yy1)-(y-y3)*(x2-x1));
  if (b > a) a = b;

  // use that to guess at the number of segments:
  int n = int(sqrt(a)/4);
  if (n > 1) {
    if (n > 100) n = 100; // make huge curves not hang forever

    double e = 1.0/n;

    // calculate the coefficients of 3rd order equation:
    double xa = (x3-3*x2+3*x1-x);
    double xb = 3*(x2-2*x1+x);
    double xc = 3*(x1-x);
    // calculate the forward differences:
    double dx1 = ((xa*e+xb)*e+xc)*e;
    double dx3 = 6*xa*e*e*e;
    double dx2 = dx3 + 2*xb*e*e;

    // calculate the coefficients of 3rd order equation:
    double ya = (y3-3*y2+3*yy1-y);
    double yb = 3*(y2-2*yy1+y);
    double yc = 3*(yy1-y);
    // calculate the forward differences:
    double dy1 = ((ya*e+yb)*e+yc)*e;
    double dy3 = 6*ya*e*e*e;
    double dy2 = dy3 + 2*yb*e*e;

    // draw points 1 .. n-2:
    for (int m=2; m<n; m++) {
      x += dx1;
      dx1 += dx2;
      dx2 += dx3;
      y += dy1;
      dy1 += dy2;
      dy2 += dy3;
      fl_transformed_vertex(x,y);
    }

    // draw point n-1:
    fl_transformed_vertex(x+dx1, y+dy1);
  }

  // draw point n:
  fl_transformed_vertex(x3,y3);
}